

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v9::detail::snprintf_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  int iVar1;
  type tVar2;
  size_t sVar3;
  size_t sVar4;
  ulong __maxlen;
  char *pcVar5;
  buffer<char> *in_RDX;
  undefined8 in_RSI;
  uint in_EDI;
  unkbyte10 in_stack_00000008;
  type size;
  int result;
  _func_int_char_ptr_size_t_char_ptr_varargs *snprintf_ptr;
  size_t capacity;
  char *begin;
  size_t offset;
  char *format_ptr;
  char format [7];
  undefined4 uVar6;
  int in_stack_ffffffffffffff7c;
  undefined4 uVar7;
  undefined2 in_stack_ffffffffffffff80;
  undefined2 uVar8;
  undefined6 in_stack_ffffffffffffff82;
  buffer<char> *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff94;
  undefined1 uVar9;
  char cVar10;
  char *local_38;
  char local_2f [7];
  buffer<char> *local_28;
  uint local_1c;
  unkbyte10 local_18;
  uint uStack_4;
  
  uStack_4 = (uint)((ulong)in_RSI >> 0x20);
  local_18 = in_stack_00000008;
  local_28 = in_RDX;
  local_1c = in_EDI;
  sVar3 = buffer<char>::capacity(in_RDX);
  sVar4 = buffer<char>::size(local_28);
  if (sVar3 <= sVar4) {
    assert_fail((char *)CONCAT62(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80),
                in_stack_ffffffffffffff7c,(char *)0x4cfc83);
  }
  if ((char)uStack_4 == '\x03') {
    local_38 = local_2f + 1;
    local_2f[0] = '%';
    if ((uStack_4 >> 0x13 & 1) != 0) {
      local_38 = local_2f + 2;
      local_2f[1] = 0x23;
    }
    if (-1 < (int)local_1c) {
      pcVar5 = local_38 + 1;
      *local_38 = '.';
      local_38 = local_38 + 2;
      *pcVar5 = '*';
    }
    *local_38 = 'L';
    uVar9 = 0x61;
    cVar10 = 'A';
    if ((uStack_4 & 0x10000) == 0) {
      cVar10 = 'a';
    }
    local_38[1] = cVar10;
    local_38[2] = '\0';
    sVar3 = buffer<char>::size(local_28);
    while( true ) {
      while( true ) {
        pcVar5 = buffer<char>::data(local_28);
        sVar4 = buffer<char>::capacity(local_28);
        __maxlen = sVar4 - sVar3;
        abort_fuzzing_if(false);
        uVar8 = (undefined2)((unkuint10)local_18 >> 0x40);
        uVar6 = (undefined4)local_18;
        uVar7 = (undefined4)((unkuint10)local_18 >> 0x20);
        if ((int)local_1c < 0) {
          iVar1 = snprintf(pcVar5 + sVar3,__maxlen,local_2f,snprintf);
        }
        else {
          iVar1 = snprintf(pcVar5 + sVar3,__maxlen,local_2f,(ulong)local_1c,snprintf);
        }
        if (-1 < iVar1) break;
        in_stack_ffffffffffffff88 = local_28;
        buffer<char>::capacity(local_28);
        buffer<char>::try_reserve
                  ((buffer<char> *)CONCAT62(in_stack_ffffffffffffff82,uVar8),CONCAT44(uVar7,uVar6));
      }
      tVar2 = to_unsigned<int>(0);
      if (tVar2 < __maxlen) break;
      buffer<char>::try_reserve
                ((buffer<char> *)CONCAT62(in_stack_ffffffffffffff82,uVar8),CONCAT44(uVar7,uVar6));
    }
    buffer<char>::try_resize
              ((buffer<char> *)
               CONCAT17(cVar10,CONCAT16(uVar9,CONCAT24(in_stack_ffffffffffffff94,iVar1))),
               (size_t)in_stack_ffffffffffffff88);
    return 0;
  }
  assert_fail((char *)CONCAT62(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80),
              in_stack_ffffffffffffff7c,(char *)0x4cfcad);
}

Assistant:

auto snprintf_float(T value, int precision, float_specs specs,
                    buffer<char>& buf) -> int {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  FMT_ASSERT(specs.format == float_format::hex, "");
  static_assert(!std::is_same<T, float>::value, "");

  // Build the format string.
  char format[7];  // The longest format is "%#.*Le".
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.upper ? 'A' : 'a';
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
    abort_fuzzing_if(precision > 100000);
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size < capacity) {
      buf.try_resize(size + offset);
      return 0;
    }
    buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
  }
}